

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

double Catch::Benchmark::Detail::anon_unknown_7::standard_deviation(double *first,double *last)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar2 = 0.0;
  dVar3 = 0.0;
  pdVar1 = first;
  if (first != last) {
    do {
      dVar3 = dVar3 + *pdVar1;
      pdVar1 = pdVar1 + 1;
    } while (pdVar1 != last);
  }
  dVar4 = (double)((long)last - (long)first >> 3);
  if (last != first) {
    dVar2 = 0.0;
    do {
      dVar5 = *first - dVar3 / dVar4;
      dVar2 = dVar2 + dVar5 * dVar5;
      first = first + 1;
    } while (first != last);
  }
  dVar2 = dVar2 / dVar4;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
    return dVar2;
  }
  return SQRT(dVar2);
}

Assistant:

static double
                standard_deviation( double const* first, double const* last ) {
                    auto m = Catch::Benchmark::Detail::mean( first, last );
                    double variance =
                        std::accumulate( first,
                                         last,
                                         0.,
                                         [m]( double a, double b ) {
                                             double diff = b - m;
                                             return a + diff * diff;
                                         } ) /
                        ( last - first );
                    return std::sqrt( variance );
                }